

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O2

char * make_bones_id(char *buf,d_level *dlev)

{
  char cVar1;
  boolean bVar2;
  s_level *psVar3;
  char *pcVar4;
  char *__format;
  
  cVar1 = dungeons[dlev->dnum].boneid;
  bVar2 = In_quest(dlev);
  pcVar4 = urole.filecode;
  if (bVar2 == '\0') {
    pcVar4 = "0";
  }
  sprintf(buf,"%c%s",(ulong)(uint)(int)cVar1,pcVar4);
  psVar3 = Is_special(dlev);
  pcVar4 = &psVar3->boneid;
  if (psVar3 == (s_level *)0x0) {
    pcVar4 = &dlev->dlevel;
  }
  __format = ".%c";
  if (psVar3 == (s_level *)0x0) {
    __format = ".%d";
  }
  sprintf(buf + 2,__format,(ulong)(uint)(int)*pcVar4);
  pcVar4 = eos(buf);
  sprintf(pcVar4,".%ld",u.ubirthday % 5);
  return buf;
}

Assistant:

static char *make_bones_id(char *buf, d_level *dlev)
{
	s_level *sptr;

	sprintf(buf, "%c%s", dungeons[dlev->dnum].boneid,
			In_quest(dlev) ? urole.filecode : "0");
	if ((sptr = Is_special(dlev)) != 0)
	    sprintf(buf+2, ".%c", sptr->boneid);
	else
	    sprintf(buf+2, ".%d", dlev->dlevel);

	/* Simple bones pool by adding a number to the bones filename.
	 * The number must stay the same for the current game. */
	sprintf(eos(buf), ".%ld", u.ubirthday % 5);

	return buf;
}